

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall
SQCompilation::CodegenVisitor::visitRootTableAccessExpr
          (CodegenVisitor *this,RootTableAccessExpr *expr)

{
  SQFuncState *this_00;
  SQInteger arg0;
  
  maybeAddInExprLine(this,&expr->super_Expr);
  this_00 = this->_fs;
  arg0 = SQFuncState::PushTarget(this_00,-1);
  SQFuncState::AddInstruction(this_00,_OP_LOADROOT,arg0,0,0,0);
  return;
}

Assistant:

void CodegenVisitor::visitRootTableAccessExpr(RootTableAccessExpr *expr) {
    maybeAddInExprLine(expr);
    _fs->AddInstruction(_OP_LOADROOT, _fs->PushTarget());
}